

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::AcesOutputFile::AcesOutputFile
          (AcesOutputFile *this,string *name,Box2i *displayWindow,Box2i *dataWindow,
          RgbaChannels rgbaChannels,float pixelAspectRatio,V2f *screenWindowCenter,
          float screenWindowWidth,LineOrder lineOrder,Compression compression,int numThreads)

{
  bool bVar1;
  Chromaticities *value;
  Chromaticities *pCVar2;
  void *pvVar3;
  Header *in_RCX;
  Header *in_RDX;
  V2f *in_RDI;
  V2f *in_R9;
  Header newHeader;
  undefined8 in_stack_ffffffffffffff40;
  Box<Imath_2_5::Vec2<int>_> *in_stack_ffffffffffffff48;
  Header *pHVar4;
  Header *header;
  Header *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff98;
  RgbaChannels in_stack_ffffffffffffff9c;
  Header *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  RgbaOutputFile *in_stack_ffffffffffffffb0;
  
  *in_RDI = (V2f)&PTR__AcesOutputFile_00562858;
  header = (Header *)(in_RDI + 1);
  value = (Chromaticities *)operator_new(8);
  Data::Data((Data *)value);
  *(Chromaticities **)&(header->_map)._M_t._M_impl = value;
  anon_unknown_14::checkCompression((Compression)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  pHVar4 = in_RDX;
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::isEmpty(in_stack_ffffffffffffff48);
  if (!bVar1) {
    in_RDX = in_RCX;
  }
  Header::Header(in_stack_ffffffffffffff80,(Box2i *)value,(Box2i *)header,
                 (float)((ulong)in_RDI >> 0x20),in_R9,(float)((ulong)pHVar4 >> 0x20),
                 (LineOrder)pHVar4,(Compression)((ulong)in_RDX >> 0x20));
  pCVar2 = acesChromaticities();
  addChromaticities(in_stack_ffffffffffffff80,value);
  acesChromaticities();
  addAdoptedNeutral(header,in_RDI);
  pvVar3 = operator_new(0x18);
  std::__cxx11::string::c_str();
  RgbaOutputFile::RgbaOutputFile
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  *(void **)in_RDI[1] = pvVar3;
  RgbaOutputFile::setYCRounding((RgbaOutputFile *)in_RDX,(uint)((ulong)pCVar2 >> 0x20),(uint)pCVar2)
  ;
  Header::~Header(in_RDX);
  return;
}

Assistant:

AcesOutputFile::AcesOutputFile
    (const std::string &name,
     const IMATH_NAMESPACE::Box2i &displayWindow,
     const IMATH_NAMESPACE::Box2i &dataWindow,
     RgbaChannels rgbaChannels,
     float pixelAspectRatio,
     const IMATH_NAMESPACE::V2f screenWindowCenter,
     float screenWindowWidth,
     LineOrder lineOrder,
     Compression compression,
     int numThreads)
:
    _data (new Data)
{
    checkCompression (compression);

    Header newHeader (displayWindow,
		      dataWindow.isEmpty()? displayWindow: dataWindow,
		      pixelAspectRatio,
		      screenWindowCenter,
		      screenWindowWidth,
		      lineOrder,
		      compression);

    addChromaticities (newHeader, acesChromaticities());
    addAdoptedNeutral (newHeader, acesChromaticities().white);

    _data->rgbaFile = new RgbaOutputFile (name.c_str(),
					  newHeader,
					  rgbaChannels,
					  numThreads);

    _data->rgbaFile->setYCRounding (7, 6);
}